

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

void __thiscall HEkkDualRow::computeDevexWeight(HEkkDualRow *this,HighsInt slice)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  this->computed_edge_weight = 0.0;
  piVar2 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->packCount;
  if (this->packCount < 1) {
    uVar4 = uVar5;
  }
  dVar6 = 0.0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = piVar2[uVar5];
    if ((this->ekk_instance_->basis_).nonbasicFlag_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[iVar1] != '\0') {
      dVar7 = (double)this->work_devex_index[iVar1] * pdVar3[uVar5];
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        dVar6 = dVar6 + dVar7 * dVar7;
        this->computed_edge_weight = dVar6;
      }
    }
  }
  return;
}

Assistant:

void HEkkDualRow::computeDevexWeight(const HighsInt slice) {
  const bool rp_computed_edge_weight = false;
  computed_edge_weight = 0;
  for (HighsInt el_n = 0; el_n < packCount; el_n++) {
    HighsInt vr_n = packIndex[el_n];
    if (!ekk_instance_.basis_.nonbasicFlag_[vr_n]) continue;
    double pv = work_devex_index[vr_n] * packValue[el_n];
    if (pv) {
      computed_edge_weight += pv * pv;
    }
  }
  if (rp_computed_edge_weight) {
    if (slice >= 0)
      printf("HEkkDualRow::computeDevexWeight: Slice %1" HIGHSINT_FORMAT
             "; computed_edge_weight = "
             "%11.4g\n",
             slice, computed_edge_weight);
  }
}